

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

int http_message_needs_eof_(http_parser *parser)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (((undefined1  [32])((undefined1  [32])*parser & (undefined1  [32])0x3) !=
       (undefined1  [32])0x0) &&
     ((undefined1  [32])((undefined1  [32])*parser & (undefined1  [32])0x84) ==
      (undefined1  [32])0x0)) {
    uVar1 = parser->status_code;
    if ((uVar1 != 0x130) && ((uVar1 != 0xcc && (uVar1 - 200 < 0xffffff9c)))) {
      uVar2 = (uint)(parser->content_length == 0xffffffffffffffff);
    }
  }
  return uVar2;
}

Assistant:

int
http_message_needs_eof_ (const http_parser *parser)
{
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      parser->flags & F_SKIPBODY) {     /* response to a HEAD request */
    return 0;
  }

  if ((parser->flags & F_CHUNKED) || parser->content_length != ULLONG_MAX) {
    return 0;
  }

  return 1;
}